

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

void __thiscall CentralBroker::CentralBroker(CentralBroker *this,char *endP)

{
  long in_RDI;
  char *in_stack_00000048;
  CentralBroker *in_stack_00000050;
  
  std::__cxx11::string::string((string *)(in_RDI + 0x18));
  std::__cxx11::string::string((string *)(in_RDI + 0x38));
  create(in_stack_00000050,in_stack_00000048);
  return;
}

Assistant:

CentralBroker::CentralBroker(const char* endP) {
    create(endP);
}